

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgsequ.c
# Opt level: O1

void zgsequ(SuperMatrix *A,double *r,double *c,double *rowcnd,double *colcnd,double *amax,int *info)

{
  void *pvVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  doublecomplex *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int ii;
  int local_34;
  
  *info = 0;
  if ((((A->nrow < 0) || (A->ncol < 0)) || (A->Stype != SLU_NC)) ||
     ((A->Dtype != SLU_Z || (A->Mtype != SLU_GE)))) {
    *info = -1;
  }
  if (*info == 0) {
    if ((A->nrow == 0) || (A->ncol == 0)) {
      *rowcnd = 1.0;
      *colcnd = 1.0;
      *amax = 0.0;
    }
    else {
      pvVar1 = A->Store;
      lVar2 = *(long *)((long)pvVar1 + 8);
      dVar10 = dmach("S");
      if (0 < (long)A->nrow) {
        memset(r,0,(long)A->nrow << 3);
      }
      uVar3 = A->ncol;
      if (0 < (int)uVar3) {
        lVar5 = 0;
        do {
          iVar4 = *(int *)(*(long *)((long)pvVar1 + 0x18) + lVar5 * 4);
          lVar7 = (long)iVar4;
          lVar8 = lVar5 + 1;
          if (iVar4 < *(int *)(*(long *)((long)pvVar1 + 0x18) + 4 + lVar5 * 4)) {
            pdVar9 = (doublecomplex *)(lVar7 * 0x10 + lVar2);
            do {
              iVar4 = *(int *)(*(long *)((long)pvVar1 + 0x10) + lVar7 * 4);
              dVar12 = r[iVar4];
              dVar11 = z_abs1(pdVar9);
              if (dVar12 <= dVar11) {
                dVar12 = z_abs1(pdVar9);
              }
              else {
                dVar12 = r[iVar4];
              }
              r[iVar4] = dVar12;
              lVar7 = lVar7 + 1;
              pdVar9 = pdVar9 + 1;
            } while (lVar7 < *(int *)(*(long *)((long)pvVar1 + 0x18) + lVar8 * 4));
          }
          uVar3 = A->ncol;
          lVar5 = lVar8;
        } while (lVar8 < (int)uVar3);
      }
      dVar14 = 1.0 / dVar10;
      iVar4 = A->nrow;
      lVar5 = (long)iVar4;
      dVar11 = 0.0;
      dVar12 = dVar14;
      if (0 < lVar5) {
        lVar7 = 0;
        do {
          dVar13 = r[lVar7];
          if (dVar11 <= dVar13) {
            dVar11 = dVar13;
          }
          if (dVar13 <= dVar12) {
            dVar12 = dVar13;
          }
          lVar7 = lVar7 + 1;
        } while (lVar5 != lVar7);
      }
      *amax = dVar11;
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        if (0 < iVar4) {
          lVar7 = 0;
          do {
            dVar13 = r[lVar7];
            if (r[lVar7] <= dVar10) {
              dVar13 = dVar10;
            }
            if (dVar14 <= dVar13) {
              dVar13 = dVar14;
            }
            r[lVar7] = 1.0 / dVar13;
            lVar7 = lVar7 + 1;
          } while (lVar5 != lVar7);
        }
        if (dVar12 <= dVar10) {
          dVar12 = dVar10;
        }
        if (dVar14 <= dVar11) {
          dVar11 = dVar14;
        }
        *rowcnd = dVar12 / dVar11;
      }
      else if (0 < iVar4) {
        lVar7 = 0;
        do {
          if ((r[lVar7] == 0.0) && (!NAN(r[lVar7]))) {
            *info = (int)lVar7 + 1;
            return;
          }
          lVar7 = lVar7 + 1;
        } while (lVar5 != lVar7);
      }
      if (0 < (int)uVar3) {
        memset(c,0,(ulong)uVar3 << 3);
      }
      uVar3 = A->ncol;
      if (0 < (int)uVar3) {
        lVar5 = 0;
        do {
          iVar4 = *(int *)(*(long *)((long)pvVar1 + 0x18) + lVar5 * 4);
          lVar7 = (long)iVar4;
          lVar8 = lVar5 + 1;
          if (iVar4 < *(int *)(*(long *)((long)pvVar1 + 0x18) + 4 + lVar5 * 4)) {
            pdVar9 = (doublecomplex *)(lVar7 * 0x10 + lVar2);
            do {
              iVar4 = *(int *)(*(long *)((long)pvVar1 + 0x10) + lVar7 * 4);
              dVar12 = c[lVar5];
              dVar11 = z_abs1(pdVar9);
              if (dVar12 <= dVar11 * r[iVar4]) {
                dVar12 = z_abs1(pdVar9);
                dVar12 = dVar12 * r[iVar4];
              }
              else {
                dVar12 = c[lVar5];
              }
              c[lVar5] = dVar12;
              lVar7 = lVar7 + 1;
              pdVar9 = pdVar9 + 1;
            } while (lVar7 < *(int *)(*(long *)((long)pvVar1 + 0x18) + lVar8 * 4));
          }
          uVar3 = A->ncol;
          lVar5 = lVar8;
        } while (lVar8 < (int)uVar3);
      }
      dVar11 = 0.0;
      dVar12 = dVar14;
      if (0 < (int)uVar3) {
        uVar6 = 0;
        do {
          dVar13 = c[uVar6];
          if (dVar11 <= dVar13) {
            dVar11 = dVar13;
          }
          if (dVar13 <= dVar12) {
            dVar12 = dVar13;
          }
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        if (0 < (int)uVar3) {
          uVar6 = 0;
          do {
            dVar13 = c[uVar6];
            if (c[uVar6] <= dVar10) {
              dVar13 = dVar10;
            }
            if (dVar14 <= dVar13) {
              dVar13 = dVar14;
            }
            c[uVar6] = 1.0 / dVar13;
            uVar6 = uVar6 + 1;
          } while (uVar3 != uVar6);
        }
        if (dVar12 <= dVar10) {
          dVar12 = dVar10;
        }
        if (dVar14 <= dVar11) {
          dVar11 = dVar14;
        }
        *colcnd = dVar12 / dVar11;
      }
      else if (0 < (int)uVar3) {
        iVar4 = -1;
        uVar6 = 0;
        do {
          if ((c[uVar6] == 0.0) && (!NAN(c[uVar6]))) {
            *info = A->nrow - iVar4;
            return;
          }
          uVar6 = uVar6 + 1;
          iVar4 = iVar4 + -1;
        } while (uVar3 != uVar6);
      }
    }
  }
  else {
    local_34 = -*info;
    input_error("zgsequ",&local_34);
  }
  return;
}

Assistant:

void
zgsequ(SuperMatrix *A, double *r, double *c, double *rowcnd,
	double *colcnd, double *amax, int *info)
{


    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    int_t i, j;
    int   irow;
    double rcmin, rcmax;
    double bignum, smlnum;
    extern double dmach(char *);
    
    /* Test the input parameters. */
    *info = 0;
    if ( A->nrow < 0 || A->ncol < 0 ||
	 A->Stype != SLU_NC || A->Dtype != SLU_Z || A->Mtype != SLU_GE )
	*info = -1;
    if (*info != 0) {
	int ii = -(*info);
	input_error("zgsequ", &ii);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || A->ncol == 0 ) {
	*rowcnd = 1.;
	*colcnd = 1.;
	*amax = 0.;
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Get machine constants. */
    smlnum = dmach("S");  /* slamch_("S"); */
    bignum = 1. / smlnum;

    /* Compute row scale factors. */
    for (i = 0; i < A->nrow; ++i) r[i] = 0.;

    /* Find the maximum element in each row. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    r[irow] = SUPERLU_MAX( r[irow], z_abs1(&Aval[i]) );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (i = 0; i < A->nrow; ++i) {
	rcmax = SUPERLU_MAX(rcmax, r[i]);
	rcmin = SUPERLU_MIN(rcmin, r[i]);
    }
    *amax = rcmax;

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (i = 0; i < A->nrow; ++i)
	    if (r[i] == 0.) {
		*info = i + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (i = 0; i < A->nrow; ++i)
	    r[i] = 1. / SUPERLU_MIN( SUPERLU_MAX( r[i], smlnum ), bignum );
	/* Compute ROWCND = min(R(I)) / max(R(I)) */
	*rowcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    /* Compute column scale factors */
    for (j = 0; j < A->ncol; ++j) c[j] = 0.;

    /* Find the maximum element in each column, assuming the row
       scalings computed above. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    c[j] = SUPERLU_MAX( c[j], z_abs1(&Aval[i]) * r[irow] );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (j = 0; j < A->ncol; ++j) {
	rcmax = SUPERLU_MAX(rcmax, c[j]);
	rcmin = SUPERLU_MIN(rcmin, c[j]);
    }

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (j = 0; j < A->ncol; ++j)
	    if ( c[j] == 0. ) {
		*info = A->nrow + j + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (j = 0; j < A->ncol; ++j)
	    c[j] = 1. / SUPERLU_MIN( SUPERLU_MAX( c[j], smlnum ), bignum);
	/* Compute COLCND = min(C(J)) / max(C(J)) */
	*colcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    return;

}